

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O1

void __thiscall gl4cts::RobustnessRobustBufferAccessBehavior::Shader::~Shader(Shader *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_id != 0) {
    iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))(this->m_id);
    this->m_id = 0;
  }
  return;
}

Assistant:

void Shader::Release()
{
	if (m_invalid_id != m_id)
	{
		const Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteShader(m_id);
		m_id = m_invalid_id;
	}
}